

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

char __thiscall
loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse_chars<2ul>
          (parser_t<events_aggregator_t> *this,char (*expected) [2])

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  bool ch;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  long lVar7;
  size_type *psVar8;
  string list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if ((*expected)[1] != '\0') {
    __assert_fail("expected[N - 1] == \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/include/loltoml/detail/parser.hpp"
                  ,0x6e,
                  "char loltoml::detail::parser_t<events_aggregator_t>::parse_chars(const char (&)[N]) [Handler = events_aggregator_t, N = 2UL]"
                 );
  }
  cVar4 = input_stream_t::get(&this->input);
  lVar7 = 0;
  ch = true;
  do {
    bVar3 = ch;
    ch = bVar3;
    if (!bVar3) goto LAB_0014eeb6;
    ch = false;
    pcVar1 = *expected + lVar7;
    lVar7 = 1;
  } while (cVar4 != *pcVar1);
  if (bVar3 != false) {
    return cVar4;
  }
LAB_0014eeb6:
  escape_char_abi_cxx11_(&local_40,(detail *)(ulong)(uint)(int)(*expected)[0],ch);
  std::operator+(&local_60,"\'",&local_40);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_80._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_80._M_dataplus._M_p == psVar8) {
    local_80.field_2._M_allocated_capacity = *psVar8;
    local_80.field_2._8_8_ = plVar5[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar8;
  }
  local_80._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::operator+(&local_a0,"Expected one of the following symbols: ",&local_80);
  sVar2 = (this->input).m_processed;
  lVar7 = 0;
  if (sVar2 != 0) {
    lVar7 = sVar2 - 1;
  }
  *puVar6 = &PTR__parser_error_t_001b0398;
  puVar6[1] = puVar6 + 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
    *(undefined4 *)(puVar6 + 3) = local_a0.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)puVar6 + 0x1c) = local_a0.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(puVar6 + 4) = local_a0.field_2._8_4_;
    *(undefined4 *)((long)puVar6 + 0x24) = local_a0.field_2._12_4_;
  }
  else {
    puVar6[1] = local_a0._M_dataplus._M_p;
    puVar6[3] = CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                         local_a0.field_2._M_allocated_capacity._0_4_);
  }
  puVar6[2] = local_a0._M_string_length;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_allocated_capacity._0_4_ =
       local_a0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  puVar6[5] = lVar7;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
}

Assistant:

char parse_chars(const char (&expected)[N]) {
        static_assert(N > 0, "No expected characters specified");
        assert(expected[N - 1] == '\0');

        char result = input.get();
        for (std::size_t i = 0; i + 1 < N; ++i) {
            if (result == expected[i]) {
                return result;
            }
        }

        std::string list = "\'" + escape_char(expected[0]) + "\'";

        for (std::size_t i = 1; i + 1 < N; ++i) {
            list += ", \'" + escape_char(expected[i]) + "\'";
        }

        throw parser_error_t("Expected one of the following symbols: " + list, last_char_offset());
    }